

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

int32 ngram_ng_prob(ngram_model_t *model,int32 wid,int32 *history,int32 n_hist,int32 *n_used)

{
  ngram_class_t *lmclass;
  int32 iVar1;
  int32 iVar2;
  ulong uVar3;
  
  if (wid == -1) {
    iVar1 = model->log_zero;
  }
  else {
    iVar1 = 0;
    if (wid < 0) {
      lmclass = *(ngram_class_t **)((long)model->classes + (ulong)((uint)wid >> 0x15 & 0x3f8));
      iVar1 = ngram_class_prob(lmclass,wid);
      if (iVar1 == 1) {
        return 1;
      }
      wid = lmclass->tag_wid;
    }
    if (0 < n_hist) {
      uVar3 = 0;
      do {
        if (history[uVar3] < -1) {
          history[uVar3] =
               **(int32 **)((long)model->classes + (ulong)((uint)history[uVar3] >> 0x15 & 0x3f8));
        }
        uVar3 = uVar3 + 1;
      } while ((uint)n_hist != uVar3);
    }
    iVar2 = (*model->funcs->raw_score)(model,wid,history,n_hist,n_used);
    iVar1 = iVar1 + iVar2;
  }
  return iVar1;
}

Assistant:

int32
ngram_ng_prob(ngram_model_t * model, int32 wid, int32 * history,
              int32 n_hist, int32 * n_used)
{
    int32 prob, class_weight = 0;
    int i;

    /* Closed vocabulary, OOV word probability is zero */
    if (wid == NGRAM_INVALID_WID)
        return model->log_zero;

    /* "Declassify" wid and history */
    if (NGRAM_IS_CLASSWID(wid)) {
        ngram_class_t *lmclass = model->classes[NGRAM_CLASSID(wid)];

        class_weight = ngram_class_prob(lmclass, wid);
        if (class_weight == 1)  /* Meaning, not found in class. */
            return class_weight;
        wid = lmclass->tag_wid;
    }
    for (i = 0; i < n_hist; ++i) {
        if (history[i] != NGRAM_INVALID_WID
            && NGRAM_IS_CLASSWID(history[i]))
            history[i] =
                model->classes[NGRAM_CLASSID(history[i])]->tag_wid;
    }
    prob = (*model->funcs->raw_score) (model, wid, history,
                                       n_hist, n_used);
    /* Multiply by unigram in-class weight. */
    return prob + class_weight;
}